

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void _setParents<pfederc::FuncExpr>
               (list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                *exprs,Expr *parent)

{
  bool bVar1;
  reference this;
  pointer this_00;
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *expr;
  iterator __end0;
  iterator __begin0;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *__range1;
  Expr *parent_local;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *exprs_local;
  
  __end0 = std::__cxx11::
           list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
           ::begin(exprs);
  expr = (unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
         std::__cxx11::
         list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
         ::end(exprs);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&expr);
    if (!bVar1) break;
    this = std::
           _List_iterator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>
           ::operator*(&__end0);
    this_00 = std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
              operator->(this);
    pfederc::Expr::setParent(&this_00->super_Expr,parent);
    std::
    _List_iterator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>::
    operator++(&__end0);
  }
  return;
}

Assistant:

static void _setParents(std::list<std::unique_ptr<T>> &exprs, Expr *parent) noexcept {
  for (std::unique_ptr<T> &expr : exprs) {
    expr->setParent(parent);
  }
}